

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sum.cpp
# Opt level: O0

AggregateFunction * duckdb::GetSumAggregateNoOverflow(PhysicalType type)

{
  BinderException *this;
  char in_SIL;
  AggregateFunction *in_RDI;
  FunctionNullHandling in_stack_0000004f;
  LogicalType *in_stack_00000050;
  LogicalType *in_stack_00000058;
  AggregateFunction *function;
  allocator *paVar1;
  allocator local_a1;
  string local_a0 [32];
  LogicalType local_80 [24];
  LogicalType local_68 [27];
  undefined1 local_4d;
  LogicalType local_40 [24];
  LogicalType local_28 [30];
  undefined1 local_a;
  
  if (in_SIL == '\a') {
    local_a = 0;
    duckdb::LogicalType::LogicalType(local_28,INTEGER);
    duckdb::LogicalType::LogicalType(local_40,HUGEINT);
    AggregateFunction::
    UnaryAggregate<duckdb::SumState<long>,int,duckdb::hugeint_t,duckdb::IntegerSumOperation,(duckdb::AggregateDestructorType)0>
              (in_stack_00000058,in_stack_00000050,in_stack_0000004f);
    duckdb::LogicalType::~LogicalType(local_40);
    duckdb::LogicalType::~LogicalType(local_28);
    std::__cxx11::string::operator=((string *)&in_RDI->field_0x8,"sum_no_overflow");
    in_RDI->order_dependent = NOT_ORDER_DEPENDENT;
    in_RDI->bind = SumNoOverflowBind;
    in_RDI->serialize = SumNoOverflowSerialize;
    in_RDI->deserialize = SumNoOverflowDeserialize;
  }
  else {
    if (in_SIL != '\t') {
      this = (BinderException *)__cxa_allocate_exception(0x10);
      paVar1 = &local_a1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a0,"Unsupported internal type for sum_no_overflow",paVar1);
      duckdb::BinderException::BinderException(this,local_a0);
      __cxa_throw(this,&BinderException::typeinfo,BinderException::~BinderException);
    }
    local_4d = 0;
    duckdb::LogicalType::LogicalType(local_68,BIGINT);
    duckdb::LogicalType::LogicalType(local_80,HUGEINT);
    AggregateFunction::
    UnaryAggregate<duckdb::SumState<long>,long,duckdb::hugeint_t,duckdb::IntegerSumOperation,(duckdb::AggregateDestructorType)0>
              (in_stack_00000058,in_stack_00000050,in_stack_0000004f);
    duckdb::LogicalType::~LogicalType(local_80);
    duckdb::LogicalType::~LogicalType(local_68);
    std::__cxx11::string::operator=((string *)&in_RDI->field_0x8,"sum_no_overflow");
    in_RDI->order_dependent = NOT_ORDER_DEPENDENT;
    in_RDI->bind = SumNoOverflowBind;
    in_RDI->serialize = SumNoOverflowSerialize;
    in_RDI->deserialize = SumNoOverflowDeserialize;
  }
  return in_RDI;
}

Assistant:

AggregateFunction GetSumAggregateNoOverflow(PhysicalType type) {
	switch (type) {
	case PhysicalType::INT32: {
		auto function = AggregateFunction::UnaryAggregate<SumState<int64_t>, int32_t, hugeint_t, IntegerSumOperation>(
		    LogicalType::INTEGER, LogicalType::HUGEINT);
		function.name = "sum_no_overflow";
		function.order_dependent = AggregateOrderDependent::NOT_ORDER_DEPENDENT;
		function.bind = SumNoOverflowBind;
		function.serialize = SumNoOverflowSerialize;
		function.deserialize = SumNoOverflowDeserialize;
		return function;
	}
	case PhysicalType::INT64: {
		auto function = AggregateFunction::UnaryAggregate<SumState<int64_t>, int64_t, hugeint_t, IntegerSumOperation>(
		    LogicalType::BIGINT, LogicalType::HUGEINT);
		function.name = "sum_no_overflow";
		function.order_dependent = AggregateOrderDependent::NOT_ORDER_DEPENDENT;
		function.bind = SumNoOverflowBind;
		function.serialize = SumNoOverflowSerialize;
		function.deserialize = SumNoOverflowDeserialize;
		return function;
	}
	default:
		throw BinderException("Unsupported internal type for sum_no_overflow");
	}
}